

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void muladd(uECC_word_t a,uECC_word_t b,uECC_word_t *r0,uECC_word_t *r1,uECC_word_t *r2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  uECC_dword_t r01;
  uECC_dword_t p;
  uECC_word_t *r2_local;
  uECC_word_t *r1_local;
  uECC_word_t *r0_local;
  uECC_word_t b_local;
  uECC_word_t a_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = b;
  auVar1 = auVar1 * auVar2;
  auVar3._8_8_ = *r1;
  auVar3._0_8_ = *r0;
  r01._8_8_ = auVar1._0_8_;
  p._0_8_ = auVar1._8_8_;
  uVar5 = SUB168(auVar1 + auVar3,0);
  uVar4 = SUB168(auVar1 + auVar3,8);
  *r2 = *r2 + (ulong)(uVar4 < (ulong)p || uVar4 - (ulong)p < (ulong)(uVar5 < r01._8_8_));
  *r1 = uVar4;
  *r0 = uVar5;
  return;
}

Assistant:

static void muladd(uECC_word_t a,
                   uECC_word_t b,
                   uECC_word_t *r0,
                   uECC_word_t *r1,
                   uECC_word_t *r2) {
#if uECC_WORD_SIZE == 8 && !SUPPORTS_INT128
    uint64_t a0 = a & 0xffffffffull;
    uint64_t a1 = a >> 32;
    uint64_t b0 = b & 0xffffffffull;
    uint64_t b1 = b >> 32;

    uint64_t i0 = a0 * b0;
    uint64_t i1 = a0 * b1;
    uint64_t i2 = a1 * b0;
    uint64_t i3 = a1 * b1;

    uint64_t p0, p1;

    i2 += (i0 >> 32);
    i2 += i1;
    if (i2 < i1) { /* overflow */
        i3 += 0x100000000ull;
    }

    p0 = (i0 & 0xffffffffull) | (i2 << 32);
    p1 = i3 + (i2 >> 32);

    *r0 += p0;
    *r1 += (p1 + (*r0 < p0));
    *r2 += ((*r1 < p1) || (*r1 == p1 && *r0 < p0));
#else
    uECC_dword_t p = (uECC_dword_t)a * b;
    uECC_dword_t r01 = ((uECC_dword_t)(*r1) << uECC_WORD_BITS) | *r0;
    r01 += p;
    *r2 += (r01 < p);
    *r1 = r01 >> uECC_WORD_BITS;
    *r0 = (uECC_word_t)r01;
#endif
}